

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cc
# Opt level: O2

void __thiscall fasttext::Vector::addRow(Vector *this,Matrix *A,int64_t i)

{
  size_t sVar1;
  uint __line;
  int64_t iVar2;
  size_t sVar3;
  char *__assertion;
  
  if (i < 0) {
    __assertion = "i >= 0";
    __line = 0x3e;
  }
  else {
    iVar2 = Matrix::size(A,0);
    if (i < iVar2) {
      sVar1 = (this->data_).size_;
      sVar3 = Matrix::size(A,1);
      if (sVar1 == sVar3) {
        (*A->_vptr_Matrix[4])(A,this,i & 0xffffffff);
        return;
      }
      __assertion = "size() == A.size(1)";
      __line = 0x40;
    }
    else {
      __assertion = "i < A.size(0)";
      __line = 0x3f;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/olegtarasov[P]fastText/src/vector.cc"
                ,__line,"void fasttext::Vector::addRow(const Matrix &, int64_t)");
}

Assistant:

void Vector::addRow(const Matrix& A, int64_t i) {
  assert(i >= 0);
  assert(i < A.size(0));
  assert(size() == A.size(1));
  A.addRowToVector(*this, i);
}